

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatMap.h
# Opt level: O2

double * __thiscall
FlatMap<Point,_double,_PointCmp>::operator[](FlatMap<Point,_double,_PointCmp> *this,Point *key)

{
  double dVar1;
  __normal_iterator<std::pair<Point,_double>_*,_std::vector<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>_>
  __position;
  tuple<> local_19;
  tuple<const_Point_&> local_18;
  
  __position = std::
               __lower_bound<__gnu_cxx::__normal_iterator<std::pair<Point,double>*,std::vector<std::pair<Point,double>,std::allocator<std::pair<Point,double>>>>,Point,__gnu_cxx::__ops::_Iter_comp_val<FlatMap<Point,double,PointCmp>::ValueToKeyComparator>>
                         ((this->vec_).
                          super__Vector_base<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->vec_).
                          super__Vector_base<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,key);
  if ((__position._M_current ==
       (this->vec_).
       super__Vector_base<std::pair<Point,_double>,_std::allocator<std::pair<Point,_double>_>_>.
       _M_impl.super__Vector_impl_data._M_finish) ||
     (dVar1 = ((__position._M_current)->first).x, key->x <= dVar1 && dVar1 != key->x)) {
    local_18.super__Tuple_impl<0UL,_const_Point_&>.super__Head_base<0UL,_const_Point_&,_false>.
    _M_head_impl = (_Tuple_impl<0UL,_const_Point_&>)(_Tuple_impl<0UL,_const_Point_&>)key;
    __position._M_current =
         (pair<Point,_double> *)
         std::vector<std::pair<Point,double>,std::allocator<std::pair<Point,double>>>::
         _M_emplace_aux<std::piecewise_construct_t_const&,std::tuple<Point_const&>,std::tuple<>>
                   ((vector<std::pair<Point,double>,std::allocator<std::pair<Point,double>>> *)this,
                    __position._M_current,(piecewise_construct_t *)&std::piecewise_construct,
                    &local_18,&local_19);
  }
  return &(__position._M_current)->second;
}

Assistant:

T& operator[](const Key& key) {
        auto pos = std::lower_bound(vec_.begin(), vec_.end(), key, valueToKeyComp_);
        if (pos == vec_.end() || comp_(key, pos->first)) {
            return vec_.emplace(pos, std::piecewise_construct, std::forward_as_tuple(key), std::tuple<>())->second;
        } else {
            return pos->second;
        }
    }